

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O3

void CChat::Com_Befriend(IResult *pResult,void *pContext)

{
  bool *pbVar1;
  bool bVar2;
  CChat *this;
  CGameClient *pCVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  long in_FS_OFFSET;
  char aMsg [128];
  char acStack_a8 [128];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this = *(CChat **)((long)pContext + 0x18);
  pCVar3 = (this->super_CComponent).m_pClient;
  iVar4 = (*pResult->_vptr_IResult[4])(pResult,0);
  iVar4 = CGameClient::GetClientID(pCVar3,(char *)CONCAT44(extraout_var,iVar4));
  if (iVar4 != -1) {
    pCVar3 = (this->super_CComponent).m_pClient;
    bVar2 = pCVar3->m_aClients[iVar4].m_Friend;
    pcVar5 = pCVar3->m_aClients[iVar4].m_aClan;
    (*(pCVar3->m_pFriends->super_IInterface)._vptr_IInterface[(ulong)bVar2 + 7])
              (pCVar3->m_pFriends,pCVar3->m_aClients + iVar4,pcVar5);
    pbVar1 = (bool *)(pcVar5 + 0x56d);
    *pbVar1 = (bool)(*pbVar1 ^ 1);
    CLineInput::Clear(&this->m_Input);
    (*(((this->super_CComponent).m_pClient)->m_pInput->super_IInterface)._vptr_IInterface[3])();
    this->m_CompletionChosen = -1;
    this->m_IgnoreCommand = false;
    this->m_SelectedCommand = 0;
    pcVar5 = "\'%s\' was added as a friend";
    if (bVar2 != false) {
      pcVar5 = "\'%s\' was removed as a friend";
    }
    pcVar5 = Localize(pcVar5,"");
    str_format(acStack_a8,0x80,pcVar5,pCVar3->m_aClients + iVar4);
    AddLine(this,acStack_a8,-2,1,-1);
  }
  this->m_Mode = 0;
  CLineInput::Deactivate(&this->m_Input);
  (*(((this->super_CComponent).m_pClient)->super_IGameClient).super_IInterface._vptr_IInterface
    [0x17])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CChat::Com_Befriend(IConsole::IResult *pResult, void *pContext)
{
	CCommandManager::SCommandContext *pCommandContext = (CCommandManager::SCommandContext *)pContext;
	CChat *pChatData = (CChat *)pCommandContext->m_pContext;

	int TargetID = pChatData->m_pClient->GetClientID(pResult->GetString(0));
	if(TargetID != -1)
	{
		CGameClient::CClientData *pTarget = &pChatData->m_pClient->m_aClients[TargetID];
		bool IsFriend = pTarget->m_Friend;
		if(IsFriend)
			pChatData->m_pClient->Friends()->RemoveFriend(pTarget->m_aName, pTarget->m_aClan);
		else
			pChatData->m_pClient->Friends()->AddFriend(pTarget->m_aName, pTarget->m_aClan);
		pTarget->m_Friend ^= 1;

		pChatData->ClearInput();

		char aMsg[128];
		str_format(aMsg, sizeof(aMsg), !IsFriend ? Localize("'%s' was added as a friend") : Localize("'%s' was removed as a friend"), pTarget->m_aName);
		pChatData->AddLine(aMsg, CLIENT_MSG, CHAT_ALL);
	}
	pChatData->Disable();
	pChatData->m_pClient->OnRelease();
}